

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O0

t_value<xemmai::t_pointer> __thiscall
xemmai::t_value<xemmai::t_slot>::f_get_at(t_value<xemmai::t_slot> *this,t_pvalue *a_index)

{
  _func_size_t_t_object_ptr_t_pvalue_ptr *p_Var1;
  t_scoped_stack tVar2;
  t_pvalue *ptVar3;
  t_type *ptVar4;
  size_t a_n;
  t_value<xemmai::t_pointer> *in_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_value<xemmai::t_pointer> tVar5;
  size_t n;
  t_scoped_stack local_30;
  t_scoped_stack stack;
  t_object *p;
  t_pvalue *a_index_local;
  t_value<xemmai::t_slot> *this_local;
  
  stack.v_p = (t_pvalue *)f_object_or_throw(a_index);
  t_scoped_stack::t_scoped_stack(&local_30,3);
  ptVar3 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  xemmai::t_value<xemmai::t_pointer>::operator=(ptVar3 + 2,in_RDX);
  ptVar4 = t_object::f_type((t_object *)stack.v_p);
  tVar2 = stack;
  p_Var1 = ptVar4->f_get_at;
  ptVar3 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  a_n = (*p_Var1)((t_object *)tVar2.v_p,ptVar3);
  if (a_n != 0xffffffffffffffff) {
    ptVar3 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
    f_loop(ptVar3,a_n);
  }
  ptVar3 = t_scoped_stack::operator_cast_to_t_value_(&local_30);
  xemmai::t_value<xemmai::t_pointer>::t_value((t_value<xemmai::t_pointer> *)this,ptVar3);
  t_scoped_stack::~t_scoped_stack(&local_30);
  tVar5.field_0.v_integer = extraout_RDX.v_integer;
  tVar5.super_t_pointer.v_p = (t_object *)this;
  return tVar5;
}

Assistant:

inline t_pvalue t_value<T_tag>::f_get_at(const t_pvalue& a_index) const
{
	auto p = f_object_or_throw();
	t_scoped_stack stack(3);
	stack[2] = a_index;
	size_t n = p->f_type()->f_get_at(p, stack);
	if (n != size_t(-1)) f_loop(stack, n);
	return stack[0];
}